

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu2_v2.c
# Opt level: O2

MPP_RET hal_h264e_vepu2_wait_v2(void *hal,HalEncTask *task)

{
  uint uVar1;
  MppPacket s;
  MPP_RET MVar2;
  uint uVar3;
  size_t sVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  
  s = task->packet;
  uVar1 = *(uint *)&task->rc_task->frm;
  sVar4 = mpp_packet_get_length(s);
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu2_v2","enter %p\n","hal_h264e_vepu2_wait_v2",hal);
  }
  if (*(MppDev *)((long)hal + 8) == (MppDev)0x0) {
    _mpp_log_l(2,"hal_h264e_vepu2_v2","invalid NULL device ctx\n",(char *)0x0);
    MVar2 = MPP_NOK;
  }
  else {
    MVar2 = mpp_dev_ioctl(*(MppDev *)((long)hal + 8),0x10,(void *)0x0);
    if (MVar2 != MPP_OK) {
      _mpp_log_l(2,"hal_h264e_vepu2_v2","poll cmd failed %d\n","hal_h264e_vepu2_wait_v2",
                 (ulong)(uint)MVar2);
    }
    *(undefined4 *)((long)hal + 600) = *(undefined4 *)((long)hal + 0x794);
    *(uint *)((long)hal + 0x21c) = (*(uint *)((long)hal + 0x6b4) >> 3) - *(int *)((long)hal + 0x218)
    ;
    *(uint *)((long)hal + 0x220) = *(uint *)((long)hal + 0x6c8) >> 10 & 0xfffffffe;
    *(uint *)((long)hal + 0x250) = (uint)*(ushort *)((long)hal + 0x782);
    *(uint *)((long)hal + 0x224) = *(uint *)((long)hal + 0x6d8) & 0x3fffff;
    uVar3 = 0x41;
    iVar10 = 0;
    uVar7 = 0;
    for (lVar6 = 0; lVar6 != 10; lVar6 = lVar6 + 1) {
      uVar9 = (uint)lVar6 & 1;
      uVar5 = (*(uint *)((long)hal + (ulong)uVar3 * 4 + 0x5e0) >> ((byte)(uVar9 << 4) ^ 0x10) &
              0xffff) * 0x20;
      iVar8 = iVar10 + 0x200000;
      if (uVar7 <= uVar5) {
        iVar8 = iVar10;
      }
      *(uint *)((long)hal + lVar6 * 4 + 0x228) = iVar8 + uVar5;
      uVar3 = uVar3 + uVar9;
      iVar10 = iVar8;
      uVar7 = uVar5;
    }
    h264e_vepu_mbrc_update
              (*(HalH264eVepuMbRcCtx *)((long)hal + 0x2f8),(HalH264eVepuMbRc *)((long)hal + 0x198));
    mpp_packet_add_segment_info
              (s,((uVar1 & 0x20) >> 3) + 1,(RK_S32)sVar4,*(RK_S32 *)((long)hal + 0x21c));
    if (*(int *)((long)hal + 0x298) == 0) {
      iVar10 = *(int *)((long)hal + 0x21c);
      if (*(long *)((long)hal + 0x2a8) != 0) {
        *(int *)((long)hal + 0x2ec) = iVar10;
        h264e_vepu_stream_amend_sync_ref_idc((HalH264eVepuStreamAmend *)((long)hal + 0x298));
        iVar10 = *(int *)((long)hal + 0x21c);
      }
    }
    else {
      *(undefined4 *)((long)hal + 0x2ec) = *(undefined4 *)((long)hal + 0x21c);
      h264e_vepu_stream_amend_proc
                ((HalH264eVepuStreamAmend *)((long)hal + 0x298),(MppEncH264HwCfg *)(*hal + 0x360));
      iVar10 = *(int *)((long)hal + 0x2f0);
      *(int *)((long)hal + 0x21c) = iVar10;
    }
    task->hw_length = task->hw_length + iVar10;
    MVar2 = MPP_OK;
    if (((byte)hal_h264e_debug & 2) != 0) {
      MVar2 = MPP_OK;
      _mpp_log_l(4,"hal_h264e_vepu2_v2","leave %p\n","hal_h264e_vepu2_wait_v2",hal);
    }
  }
  return MVar2;
}

Assistant:

static MPP_RET hal_h264e_vepu2_wait_v2(void *hal, HalEncTask *task)
{
    HalH264eVepu2Ctx *ctx = (HalH264eVepu2Ctx *)hal;
    HalH264eVepuMbRc *hw_mbrc = &ctx->hw_mbrc;
    H264NaluType type = task->rc_task->frm.is_idr ?  H264_NALU_TYPE_IDR : H264_NALU_TYPE_SLICE;
    MppPacket pkt = task->packet;
    RK_S32 offset = mpp_packet_get_length(pkt);
    MPP_RET ret = MPP_NOK;

    hal_h264e_dbg_func("enter %p\n", hal);

    if (ctx->dev) {
        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_POLL, NULL);
        if (ret)
            mpp_err_f("poll cmd failed %d\n", ret);
    } else {
        mpp_err("invalid NULL device ctx\n");
        return ret;
    }

    h264e_vepu2_get_mbrc(hw_mbrc, &ctx->regs_get);
    h264e_vepu_mbrc_update(ctx->rc_ctx, hw_mbrc);

    mpp_packet_add_segment_info(pkt, type, offset, hw_mbrc->out_strm_size);

    {
        HalH264eVepuStreamAmend *amend = &ctx->amend;

        if (amend->enable) {
            amend->old_length = hw_mbrc->out_strm_size;
            h264e_vepu_stream_amend_proc(amend, &ctx->cfg->codec.h264.hw_cfg);
            ctx->hw_mbrc.out_strm_size = amend->new_length;
        } else if (amend->prefix) {
            /* check prefix value */
            amend->old_length = hw_mbrc->out_strm_size;
            h264e_vepu_stream_amend_sync_ref_idc(amend);
        }
    }

    task->hw_length += ctx->hw_mbrc.out_strm_size;

    hal_h264e_dbg_func("leave %p\n", hal);

    return MPP_OK;
}